

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 (*pauVar8) [16];
  ulong *puVar9;
  long lVar10;
  long in_RDX;
  word *in_RSI;
  ulong *in_RDI;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint i;
  word idx;
  uint w;
  word128 cval [4];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  uint i_2;
  uint i_1;
  int local_23c;
  word local_238;
  int local_22c;
  ulong local_228 [4];
  ulong local_208 [5];
  word *local_1e0;
  ulong *local_1d8;
  ulong *local_178;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  uint local_100;
  undefined4 local_fc;
  ulong local_f8;
  ulong uStack_f0;
  long local_e0;
  ulong *local_d8;
  undefined1 (*local_d0) [16];
  undefined1 local_c8 [16];
  ulong local_b8;
  ulong uStack_b0;
  uint local_a0;
  undefined4 local_9c;
  ulong local_98;
  ulong uStack_90;
  long local_80;
  ulong *local_78;
  undefined1 (*local_70) [16];
  undefined1 local_68 [16];
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_228[0] = *in_RDI;
  local_228[1] = in_RDI[1];
  local_178 = in_RDI + 2;
  local_228[2] = *local_178;
  local_228[3] = in_RDI[3];
  local_118 = (undefined1  [16])0x0;
  local_208[0] = 0;
  local_208[1] = 0;
  local_128 = (undefined1  [16])0x0;
  local_128._0_8_ = 0;
  local_128._8_8_ = 0;
  local_208[2] = 0;
  local_208[3] = 0;
  uVar11 = local_128._0_8_;
  uVar13 = local_128._8_8_;
  local_208[4] = in_RDX;
  local_1e0 = in_RSI;
  local_1d8 = in_RDI;
  for (local_22c = 4; local_22c != 0; local_22c = local_22c + -1) {
    local_238 = *local_1e0;
    for (local_23c = 0x40; uVar4 = local_208[4], local_23c != 0; local_23c = local_23c + -2) {
      mm128_compute_mask(local_238,0);
      local_80 = uVar4;
      local_9c = 2;
      uVar12 = uVar11;
      uVar14 = uVar13;
      for (local_a0 = 0; local_a0 != 2; local_a0 = local_a0 + 1) {
        uVar2 = local_228[(ulong)local_a0 * 2];
        uVar3 = local_228[(ulong)local_a0 * 2 + 1];
        pauVar8 = (undefined1 (*) [16])(uVar4 + (ulong)local_a0 * 0x10);
        uVar5 = *(undefined8 *)*pauVar8;
        uVar6 = *(undefined8 *)(*pauVar8 + 8);
        auVar7._8_8_ = uVar13;
        auVar7._0_8_ = uVar11;
        auVar1 = vpand_avx(*pauVar8,auVar7);
        local_68._0_8_ = auVar1._0_8_;
        local_68._8_8_ = auVar1._8_8_;
        uVar12 = uVar2 ^ local_68._0_8_;
        uVar14 = uVar3 ^ local_68._8_8_;
        local_228[(ulong)local_a0 * 2] = uVar12;
        local_228[(ulong)local_a0 * 2 + 1] = uVar14;
        local_70 = pauVar8;
        local_68 = auVar1;
        local_58 = uVar2;
        uStack_50 = uVar3;
        local_48 = uVar11;
        uStack_40 = uVar13;
        local_38 = uVar5;
        uStack_30 = uVar6;
      }
      puVar9 = local_228 + 4;
      lVar10 = local_208[4] + 0x20;
      local_98 = uVar11;
      uStack_90 = uVar13;
      local_78 = local_228;
      mm128_compute_mask(local_238,1);
      local_fc = 2;
      uVar11 = uVar12;
      uVar13 = uVar14;
      for (local_100 = 0; local_100 != 2; local_100 = local_100 + 1) {
        uVar4 = puVar9[(ulong)local_100 * 2];
        uVar2 = local_228[(ulong)local_100 * 2 + 5];
        pauVar8 = (undefined1 (*) [16])(lVar10 + (ulong)local_100 * 0x10);
        uVar5 = *(undefined8 *)*pauVar8;
        uVar6 = *(undefined8 *)(*pauVar8 + 8);
        auVar1._8_8_ = uVar14;
        auVar1._0_8_ = uVar12;
        auVar1 = vpand_avx(*pauVar8,auVar1);
        local_c8._0_8_ = auVar1._0_8_;
        local_c8._8_8_ = auVar1._8_8_;
        uVar11 = uVar4 ^ local_c8._0_8_;
        uVar13 = uVar2 ^ local_c8._8_8_;
        puVar9[(ulong)local_100 * 2] = uVar11;
        local_228[(ulong)local_100 * 2 + 5] = uVar13;
        local_d0 = pauVar8;
        local_c8 = auVar1;
        local_b8 = uVar4;
        uStack_b0 = uVar2;
        local_28 = uVar12;
        uStack_20 = uVar14;
        local_18 = uVar5;
        uStack_10 = uVar6;
      }
      local_238 = local_238 >> 2;
      local_208[4] = local_208[4] + 0x40;
      local_f8 = uVar12;
      uStack_f0 = uVar14;
      local_e0 = lVar10;
      local_d8 = puVar9;
    }
    local_1e0 = local_1e0 + 1;
  }
  *local_1d8 = local_228[0] ^ local_208[0];
  local_1d8[1] = local_228[1] ^ local_208[1];
  local_1d8[2] = local_228[2] ^ local_208[2];
  local_1d8[3] = local_228[3] ^ local_208[3];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(&cblock->w64[0]), mm128_load(&cblock->w64[2]), mm128_zero,
                     mm128_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 2) {
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
    }
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}